

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noccout.c
# Opt level: O0

void debugprintitem(Item *q)

{
  short *in_RDI;
  
  if (*in_RDI == 1) {
    printf("SYM %s\n",*(undefined8 *)(*(long *)(in_RDI + 4) + 0x48));
  }
  else if (*in_RDI == 0x102) {
    printf("VERB %s\n",*(undefined8 *)(in_RDI + 4));
  }
  else if (*in_RDI == 2) {
    printf("ITM ");
    debugprintitem((Item *)0x11e3fa);
  }
  else {
    printf("STR %s\n",*(undefined8 *)(in_RDI + 4));
  }
  return;
}

Assistant:

void debugprintitem(q) Item* q; {
		if (q->itemtype == SYMBOL) {
			printf("SYM %s\n", SYM(q)->name);
		} else if (q->itemtype == VERBATIM) {
			printf("VERB %s\n",STR(q));
		} else if (q->itemtype == ITEM) {
			printf("ITM ");
			debugprintitem(ITM(q));
		}else {
			printf("STR %s\n", STR(q));
		}
}